

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O1

WebPIDecoder *
WebPINewYUVA(uint8_t *luma,size_t luma_size,int luma_stride,uint8_t *u,size_t u_size,int u_stride,
            uint8_t *v,size_t v_size,int v_stride,uint8_t *a,size_t a_size,int a_stride)

{
  WebPIDecoder *pWVar1;
  WEBP_CSP_MODE WVar2;
  WebPIDecoder *pWVar3;
  uint8_t *local_58;
  
  WVar2 = MODE_YUVA;
  if (luma == (uint8_t *)0x0) {
    luma_stride = 0;
    u = (uint8_t *)0x0;
    u_size = 0;
    u_stride = 0;
    v = (uint8_t *)0x0;
    v_size = 0;
    v_stride = 0;
    local_58 = (uint8_t *)0x0;
    a_size = 0;
    a_stride = 0;
    luma_size = 0;
  }
  else {
    if (((v == (uint8_t *)0x0 || u == (uint8_t *)0x0) ||
        (v_size == 0 || (u_size == 0 || luma_size == 0))) ||
       (v_stride == 0 || (u_stride == 0 || luma_stride == 0))) {
      return (WebPIDecoder *)0x0;
    }
    local_58 = a;
    if (a == (uint8_t *)0x0) {
      WVar2 = MODE_YUV;
    }
    else if (a_stride == 0 || a_size == 0) {
      return (WebPIDecoder *)0x0;
    }
  }
  pWVar1 = NewDecoder((WebPDecBuffer *)0x0,(WebPBitstreamFeatures *)0x0);
  pWVar3 = (WebPIDecoder *)0x0;
  if (pWVar1 != (WebPIDecoder *)0x0) {
    (pWVar1->output).colorspace = WVar2;
    (pWVar1->output).is_external_memory = (uint)(luma != (uint8_t *)0x0);
    (pWVar1->output).u.RGBA.rgba = luma;
    (pWVar1->output).u.YUVA.y_stride = luma_stride;
    (pWVar1->output).u.YUVA.y_size = luma_size;
    (pWVar1->output).u.YUVA.u = u;
    (pWVar1->output).u.YUVA.u_stride = u_stride;
    (pWVar1->output).u.YUVA.u_size = u_size;
    (pWVar1->output).u.YUVA.v = v;
    (pWVar1->output).u.YUVA.v_stride = v_stride;
    (pWVar1->output).u.YUVA.v_size = v_size;
    (pWVar1->output).u.YUVA.a = local_58;
    (pWVar1->output).u.YUVA.a_stride = a_stride;
    (pWVar1->output).u.YUVA.a_size = a_size;
    pWVar3 = pWVar1;
  }
  return pWVar3;
}

Assistant:

WebPIDecoder* WebPINewYUVA(uint8_t* luma, size_t luma_size, int luma_stride,
                           uint8_t* u, size_t u_size, int u_stride,
                           uint8_t* v, size_t v_size, int v_stride,
                           uint8_t* a, size_t a_size, int a_stride) {
  const int is_external_memory = (luma != NULL) ? 1 : 0;
  WebPIDecoder* idec;
  WEBP_CSP_MODE colorspace;

  if (is_external_memory == 0) {    // Overwrite parameters to sane values.
    luma_size = u_size = v_size = a_size = 0;
    luma_stride = u_stride = v_stride = a_stride = 0;
    u = v = a = NULL;
    colorspace = MODE_YUVA;
  } else {  // A luma buffer was passed. Validate the other parameters.
    if (u == NULL || v == NULL) return NULL;
    if (luma_size == 0 || u_size == 0 || v_size == 0) return NULL;
    if (luma_stride == 0 || u_stride == 0 || v_stride == 0) return NULL;
    if (a != NULL) {
      if (a_size == 0 || a_stride == 0) return NULL;
    }
    colorspace = (a == NULL) ? MODE_YUV : MODE_YUVA;
  }

  idec = WebPINewDecoder(NULL);
  if (idec == NULL) return NULL;

  idec->output.colorspace = colorspace;
  idec->output.is_external_memory = is_external_memory;
  idec->output.u.YUVA.y = luma;
  idec->output.u.YUVA.y_stride = luma_stride;
  idec->output.u.YUVA.y_size = luma_size;
  idec->output.u.YUVA.u = u;
  idec->output.u.YUVA.u_stride = u_stride;
  idec->output.u.YUVA.u_size = u_size;
  idec->output.u.YUVA.v = v;
  idec->output.u.YUVA.v_stride = v_stride;
  idec->output.u.YUVA.v_size = v_size;
  idec->output.u.YUVA.a = a;
  idec->output.u.YUVA.a_stride = a_stride;
  idec->output.u.YUVA.a_size = a_size;
  return idec;
}